

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetDeprecation_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  pointer pcVar1;
  cmValue cVar2;
  string local_38;
  
  local_38.field_2._M_allocated_capacity._0_7_ = 0x41434552504544;
  local_38.field_2._7_4_ = 0x4e4f4954;
  local_38._M_string_length = 0xb;
  local_38.field_2._M_local_buf[0xb] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  cVar2 = GetProperty(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT17(local_38.field_2._M_local_buf[7],
                             local_38.field_2._M_allocated_capacity._0_7_) + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (cVar2.Value == (string *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = ((cVar2.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (cVar2.Value)->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDeprecation() const
{
  // find DEPRECATION property
  if (cmValue deprecation = this->GetProperty("DEPRECATION")) {
    return *deprecation;
  }
  return std::string();
}